

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgclient.c
# Opt level: O0

int mg_bolt_init(mg_session *session,mg_session_params *params)

{
  int iVar1;
  int iVar2;
  mg_session *in_RDI;
  mg_session *unaff_retaddr;
  int status_2;
  mg_message *response;
  int status_1;
  int status;
  mg_allocator *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  mg_session *in_stack_ffffffffffffffd8;
  int local_1c;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_RDI->version == 1) {
    iVar1 = mg_bolt_init_v1(in_stack_ffffffffffffffd8,
                            (mg_session_params *)
                            CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  }
  else {
    iVar1 = mg_bolt_init_v4(in_stack_ffffffffffffffd8,
                            (mg_session_params *)
                            CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  }
  iVar2 = iVar1;
  if (((iVar1 == 0) &&
      (iVar2 = mg_session_receive_message((mg_session *)((ulong)in_stack_ffffffffffffffd4 << 0x20)),
      iVar2 == 0)) &&
     (iVar2 = mg_session_read_bolt_message
                        ((mg_session *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                         ,(mg_message **)in_RDI), iVar2 == 0)) {
    if (in_stack_ffffffffffffffd8->status == 1) {
      local_1c = 0;
    }
    else if (in_stack_ffffffffffffffd8->status == 2) {
      local_1c = handle_failure_message
                           (unaff_retaddr,
                            (mg_message_failure *)
                            CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    }
    else {
      local_1c = -10;
      mg_session_set_error(in_RDI,"unexpected message type");
    }
    mg_message_destroy_ca((mg_message *)CONCAT44(iVar2,iVar1),in_stack_ffffffffffffffc8);
    iVar2 = local_1c;
  }
  return iVar2;
}

Assistant:

static int mg_bolt_init(mg_session *session, const mg_session_params *params) {
  int status = session->version == 1 ? mg_bolt_init_v1(session, params)
                                     : mg_bolt_init_v4(session, params);
  if (status != 0) {
    return status;
  }

  MG_RETURN_IF_FAILED(mg_session_receive_message(session));

  mg_message *response;
  MG_RETURN_IF_FAILED(mg_session_read_bolt_message(session, &response));

  if (response->type == MG_MESSAGE_TYPE_SUCCESS) {
    status = 0;
  } else if (response->type == MG_MESSAGE_TYPE_FAILURE) {
    status = handle_failure_message(session, response->failure_v);
  } else {
    status = MG_ERROR_PROTOCOL_VIOLATION;
    mg_session_set_error(session, "unexpected message type");
  }

  mg_message_destroy_ca(response, session->decoder_allocator);
  return status;
}